

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.c
# Opt level: O0

apx_vm_deserializer_t * apx_vm_deserializer_new(void)

{
  apx_error_t aVar1;
  apx_vm_deserializer_t *paStack_10;
  apx_error_t rc;
  apx_vm_deserializer_t *self;
  
  paStack_10 = (apx_vm_deserializer_t *)malloc(0x68);
  if ((paStack_10 != (apx_vm_deserializer_t *)0x0) &&
     (aVar1 = apx_vm_deserializer_create(paStack_10), aVar1 != 0)) {
    free(paStack_10);
    paStack_10 = (apx_vm_deserializer_t *)0x0;
  }
  return paStack_10;
}

Assistant:

apx_vm_deserializer_t* apx_vm_deserializer_new(void)
{
   apx_vm_deserializer_t* self = (apx_vm_deserializer_t*) malloc(sizeof(apx_vm_deserializer_t));
   if (self != NULL)
   {
      apx_error_t rc = apx_vm_deserializer_create(self);
      if (rc != APX_NO_ERROR)
      {
         free(self);
         self = NULL;
      }
   }
   return self;
}